

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void Imf_2_5::(anonymous_namespace)::checkIsNullTerminated<256ul>(char (*str) [256],char *what)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  InputExc *this;
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((*str)[0] != '\0') {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 0xfe) goto LAB_0012518a;
      uVar1 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar1;
    } while ((*str)[lVar2] != '\0');
    if (0xfe < uVar1) {
LAB_0012518a:
      std::__cxx11::stringstream::stringstream(asStack_198);
      std::__ostream_insert<char,std::char_traits<char>>(local_188,"Invalid ",8);
      poVar4 = std::operator<<(local_188,what);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": it is more than ",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," characters long.",0x11);
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this,asStack_198);
      __cxa_throw(this,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
  }
  return;
}

Assistant:

void checkIsNullTerminated (const char (&str)[N], const char *what)
{
	for (size_t i = 0; i < N; ++i) {
		if (str[i] == '\0')
			return;
	}
	std::stringstream s;
	s << "Invalid " << what << ": it is more than " << (N - 1) 
		<< " characters long.";
	throw IEX_NAMESPACE::InputExc(s);
}